

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer_e2e_test.cpp
# Opt level: O3

WaitResult<bool> __thiscall FindUserDataCallable::operator()(FindUserDataCallable *this)

{
  pointer __s2;
  _List_node_base *__n;
  int iVar1;
  int3 iVar2;
  _List_node_base *p_Var3;
  list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> peers;
  _List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> local_40;
  
  udpdiscovery::Peer::ListDiscovered_abi_cxx11_
            ((list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> *)
             &local_40,this->peer_);
  if (local_40._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_40) {
    __s2 = (this->user_data_)._M_dataplus._M_p;
    __n = (_List_node_base *)(this->user_data_)._M_string_length;
    p_Var3 = local_40._M_impl._M_node.super__List_node_base._M_next;
    do {
      if (p_Var3[2]._M_next == __n) {
        iVar2 = 1;
        if (__n == (_List_node_base *)0x0) goto LAB_00107745;
        iVar1 = bcmp(p_Var3[1]._M_prev,__s2,(size_t)__n);
        if (iVar1 == 0) goto LAB_00107745;
      }
      p_Var3 = (((_List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
                  *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var3 != (_List_node_base *)&local_40);
  }
  iVar2 = 0;
LAB_00107745:
  std::__cxx11::
  _List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::_M_clear
            (&local_40);
  return (WaitResult<bool>)(iVar2 << 8 | 0x10000);
}

Assistant:

WaitResult<bool> operator()() {
    std::list<udpdiscovery::DiscoveredPeer> peers = peer_.ListDiscovered();
    for (std::list<udpdiscovery::DiscoveredPeer>::iterator it = peers.begin();
         it != peers.end(); ++it) {
      if ((*it).user_data() == user_data_) {
        WaitResult<bool> result;
        result.has_result = true;
        result.result = true;

        return result;
      }
    }

    return WaitResult<bool>();
  }